

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  value_type val1;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  int i_3;
  AssertionResult gtest_ar_3;
  int i_2;
  AssertionResult gtest_ar_2;
  TypeParam ht2;
  AssertionResult gtest_ar_1;
  int i_1;
  int pre_copies;
  AssertionResult gtest_ar;
  int i;
  int kThreshold;
  float kResize;
  size_type kSize;
  float in_stack_fffffffffffffc88;
  float in_stack_fffffffffffffc8c;
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc90;
  HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc98;
  char *in_stack_fffffffffffffca0;
  key_type in_stack_fffffffffffffca8;
  int line;
  allocator_type *in_stack_fffffffffffffcb0;
  value_type in_stack_fffffffffffffcb8;
  Type type;
  hasher *in_stack_fffffffffffffcc0;
  size_type in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  uint i_00;
  value_type *in_stack_fffffffffffffd08;
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd10;
  AssertionResult local_2b8 [3];
  value_type local_280;
  size_type local_268;
  AssertionResult local_260;
  key_type local_24c;
  int local_244;
  size_type local_230;
  AssertionResult local_228 [3];
  value_type local_1ec;
  int local_1e4;
  size_type local_1d0;
  AssertionResult local_1c8;
  key_type local_1b8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1b0 [12];
  int local_e8;
  int local_e4;
  AssertionResult local_e0 [3];
  value_type local_a8;
  key_type local_a0;
  int local_98;
  int local_94;
  size_type local_70;
  AssertionResult local_68 [3];
  value_type local_2c;
  int local_24;
  key_type local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0x400;
  local_14 = 0x3f4ccccd;
  local_18 = 0x332;
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88);
  local_20 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffc98,(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffc90,
                    (key_type *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  for (local_24 = 0; local_24 < 0x333; local_24 = local_24 + 1) {
    local_2c = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),0);
    google::
    BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  }
  local_70 = google::
             BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x103ac00);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             (unsigned_long *)in_stack_fffffffffffffc98,(unsigned_long *)in_stack_fffffffffffffc90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
    in_stack_fffffffffffffd10 =
         (BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0x103ac67);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8.second,
               (char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8.second,
               in_stack_fffffffffffffca0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd10,(Message *)in_stack_fffffffffffffd08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
    testing::Message::~Message((Message *)0x103acca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x103ad3b);
  local_94 = google::
             BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::num_table_copies((BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                 *)0x103ad4c);
  for (local_98 = 0; local_98 < 0x400; local_98 = local_98 + 1) {
    local_a0 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffc98,(int)((ulong)in_stack_fffffffffffffc90 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffc90,
            (key_type *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    in_stack_fffffffffffffd08 = (value_type *)(in_RDI + 0x10);
    local_a8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),0);
    google::
    BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  }
  local_e4 = google::
             BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::num_table_copies((BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                 *)0x103ae26);
  local_e8 = local_94 + 2;
  testing::internal::CmpHelperLT<int,int>
            ((char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             (int *)in_stack_fffffffffffffc98,(int *)in_stack_fffffffffffffc90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x103ae9d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8.second,
               (char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8.second,
               in_stack_fffffffffffffca0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd10,(Message *)in_stack_fffffffffffffd08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
    testing::Message::~Message((Message *)0x103aefa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x103af6b);
  i_00 = 0;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffc90,(int)in_stack_fffffffffffffc8c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffc90,(int)in_stack_fffffffffffffc8c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_1b0,i_00,(int *)(ulong)i_00);
  google::
  HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(i_00,in_stack_fffffffffffffcd0),in_stack_fffffffffffffcc8,
             in_stack_fffffffffffffcc0,(key_equal *)in_stack_fffffffffffffcb8,
             in_stack_fffffffffffffcb0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_1b0);
  local_1b8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffc98,(int)((ulong)in_stack_fffffffffffffc90 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffc90,
                    (key_type *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88);
  local_1d0 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x103b04a);
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            ((char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             (unsigned_long *)in_stack_fffffffffffffc98,(unsigned_long *)in_stack_fffffffffffffc90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
    in_stack_fffffffffffffcc0 =
         (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0x103b104);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8.second,
               (char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8.second,
               in_stack_fffffffffffffca0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd10,(Message *)in_stack_fffffffffffffd08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
    testing::Message::~Message((Message *)0x103b161);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x103b1d2);
  for (local_1e4 = 0; local_1e4 < 0x333; local_1e4 = local_1e4 + 1) {
    in_stack_fffffffffffffcb8 =
         HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),0);
    local_1ec = in_stack_fffffffffffffcb8;
    google::
    BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  }
  local_230 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x103b267);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             (unsigned_long *)in_stack_fffffffffffffc98,(unsigned_long *)in_stack_fffffffffffffc90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_228);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
    in_stack_fffffffffffffcb0 =
         (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0x103b2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8.second,
               (char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8.second,
               in_stack_fffffffffffffca0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd10,(Message *)in_stack_fffffffffffffd08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
    testing::Message::~Message((Message *)0x103b32d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x103b39e);
  for (local_244 = 0; type = in_stack_fffffffffffffcb8.second, local_244 < 0x333;
      local_244 = local_244 + 1) {
    in_stack_fffffffffffffca8 =
         HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffffc98,(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
    local_24c = in_stack_fffffffffffffca8;
    google::
    BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffc90,
            (key_type *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    local_268 = google::
                BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0x103b408);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
               (unsigned_long *)in_stack_fffffffffffffc98,(unsigned_long *)in_stack_fffffffffffffc90
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_260);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
      in_stack_fffffffffffffca0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x103b483);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8.second,
                 (char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8.second,
                 in_stack_fffffffffffffca0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffd10,(Message *)in_stack_fffffffffffffd08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
      testing::Message::~Message((Message *)0x103b4e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x103b54b);
  }
  val1 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),0);
  local_280 = val1;
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0x103b5c5);
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,(unsigned_long *)val1,
             (unsigned_long *)in_stack_fffffffffffffc90);
  line = in_stack_fffffffffffffca8.second;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
    this_00 = (AssertHelper *)
              testing::AssertionResult::failure_message((AssertionResult *)0x103b62e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffcc0,type,(char *)in_stack_fffffffffffffcb0,line
               ,in_stack_fffffffffffffca0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd10,(Message *)in_stack_fffffffffffffd08);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x103b68b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x103b6f6);
  google::
  HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0x103b703);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}